

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_edit_draw_text(nk_command_buffer *out,nk_style_edit *style,float pos_x,float pos_y,
                      float x_offset,char *text,int byte_len,float row_height,nk_user_font *font,
                      nk_color background,nk_color foreground,int is_selected)

{
  long lVar1;
  nk_style_edit *pnVar2;
  nk_command_buffer *pnVar3;
  nk_style_edit *pnVar4;
  int iVar5;
  undefined4 in_register_0000000c;
  uint clen;
  int iVar6;
  long lVar7;
  long lVar8;
  nk_user_font *f;
  int iVar9;
  long lVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float in_XMM0_Db;
  float in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar15;
  float fVar14;
  undefined4 in_XMM3_Db;
  nk_rect rect;
  nk_rect b;
  nk_rect rect_00;
  nk_rect b_00;
  nk_text txt;
  int local_100;
  nk_rune local_f8;
  nk_color local_f4;
  uint local_f0;
  float local_ec;
  float local_e8;
  float fStack_e4;
  undefined8 uStack_e0;
  nk_style_edit *local_d8;
  ulong local_d0;
  nk_command_buffer *local_c8;
  nk_user_font *local_c0;
  nk_style_edit *local_b8;
  ulong local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  undefined4 uStack_84;
  float local_78;
  nk_text local_68;
  undefined8 local_58;
  byte *local_40;
  ulong local_38;
  
  local_78 = x_offset;
  if ((nk_user_font *)CONCAT44(in_register_0000000c,byte_len) == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x5828,
                  "void nk_edit_draw_text(struct nk_command_buffer *, const struct nk_style_edit *, float, float, float, const char *, int, float, const struct nk_user_font *, struct nk_color, struct nk_color, int)"
                 );
  }
  clen = (uint)text;
  uVar11 = (ulong)text & 0xffffffff;
  if (clen != 0 && style != (nk_style_edit *)0x0) {
    local_f8 = 0;
    local_68.padding.x = 0.0;
    local_68.padding.y = 0.0;
    local_f4 = SUB84(font,0);
    local_ec = pos_y;
    local_a8 = pos_x;
    fStack_a4 = in_XMM0_Db;
    fStack_a0 = in_XMM0_Dc;
    uStack_9c = in_XMM0_Dd;
    local_88 = row_height;
    uStack_84 = in_XMM3_Db;
    local_68.background = local_f4;
    local_68.text = background;
    iVar5 = nk_utf_decode((char *)style,&local_f8,clen);
    if (0 < (int)clen && iVar5 != 0) {
      local_78 = local_78 + local_a8;
      local_38 = (ulong)text & 0xffffffff;
      local_40 = (byte *)((long)&(style->normal).type + 1);
      local_98 = 0;
      uStack_90 = 0;
      local_d0 = 0;
      local_100 = 0;
      local_f0 = clen;
      local_d8 = style;
      local_c8 = out;
      local_c0 = (nk_user_font *)CONCAT44(in_register_0000000c,byte_len);
      local_b8 = style;
LAB_00145ecd:
      local_e8 = 0.0;
      fStack_e4 = 0.0;
      uStack_e0 = 0;
      do {
        lVar8 = (long)local_100;
        lVar7 = lVar8 << 0x20;
        local_b0 = (ulong)(uint)((int)uVar11 - local_100);
        local_58 = local_40 + lVar8;
        iVar6 = -1;
        lVar10 = 0;
LAB_00145f0c:
        pnVar2 = local_b8;
        f = local_c0;
        pnVar3 = local_c8;
        fVar12 = fStack_e4;
        if (local_f8 == 0xd) {
          lVar1 = lVar8 + 1 + lVar10;
          iVar5 = nk_utf_decode((char *)(local_58 + lVar10),&local_f8,(int)local_b0 + iVar6);
          lVar10 = lVar10 + 1;
          if (lVar1 < (long)local_38) goto code_r0x00145f4e;
          goto LAB_00146112;
        }
        iVar9 = (int)lVar10;
        if (local_f8 == 10) goto LAB_00145ffc;
        fVar12 = (*local_c0->width)(local_c0->userdata,local_c0->height,
                                    (char *)((long)&(local_b8->normal).type + (lVar7 >> 0x20)),iVar5
                                   );
        local_e8 = local_e8 + fVar12;
        iVar6 = local_100 + iVar5;
        local_100 = iVar6 + iVar9;
        iVar5 = nk_utf_decode((char *)((long)&(pnVar2->normal).type + (long)local_100),&local_f8,
                              ((int)local_b0 - iVar5) - iVar9);
        if (((int)local_f0 <= local_100) || (uVar11 = (ulong)local_f0, iVar5 == 0)) {
          local_100 = iVar6 + iVar9;
LAB_00146124:
          pnVar4 = local_b8;
          pnVar3 = local_c8;
          pnVar2 = local_d8;
          fVar12 = fStack_e4;
          if (local_e8 <= 0.0) {
            return;
          }
          fVar14 = (float)local_98 + local_ec;
          fVar13 = local_a8;
          if ((int)local_d0 == 0) {
            fVar13 = local_78;
          }
          fVar15 = local_88;
          if (foreground != (nk_color)0x0) {
            fStack_a0 = fStack_a4;
            uStack_9c = local_98._4_4_;
            fStack_e4 = local_88;
            uStack_e0 = CONCAT44(uStack_84,fVar12);
            rect_00.y = fVar14;
            rect_00.x = fVar13;
            rect_00.h = local_88;
            rect_00.w = local_e8;
            local_a8 = fVar13;
            fStack_a4 = fVar14;
            nk_fill_rect(local_c8,rect_00,0.0,local_f4);
            fVar13 = local_a8;
            fVar14 = fStack_a4;
            fVar15 = fStack_e4;
          }
          b_00.y = fVar14;
          b_00.x = fVar13;
          b_00.h = fVar15;
          b_00.w = local_e8;
          nk_widget_text(pnVar3,b_00,(char *)pnVar2,((int)pnVar4 + local_100) - (int)pnVar2,
                         &local_68,0x11,f);
          return;
        }
      } while( true );
    }
  }
  return;
code_r0x00145f4e:
  lVar7 = lVar7 + 0x100000000;
  iVar6 = iVar6 + -1;
  if (iVar5 == 0) {
LAB_00146112:
    local_100 = local_100 + (int)lVar10;
    f = local_c0;
    goto LAB_00146124;
  }
  goto LAB_00145f0c;
LAB_00145ffc:
  fVar14 = (float)local_98 + local_ec;
  fVar13 = local_a8;
  if ((int)local_d0 == 0) {
    fVar13 = local_78;
  }
  fVar15 = local_88;
  if (foreground != (nk_color)0x0) {
    fStack_e4 = local_88;
    uStack_e0 = CONCAT44(uStack_84,fVar12);
    local_58 = (byte *)CONCAT44(fVar14,fVar13);
    rect.y = fVar14;
    rect.x = fVar13;
    rect.h = local_88;
    rect.w = local_e8;
    nk_fill_rect(local_c8,rect,0.0,local_f4);
    fVar15 = fStack_e4;
    fVar13 = (float)local_58;
    fVar14 = local_58._4_4_;
  }
  pnVar2 = local_b8;
  b.y = fVar14;
  b.x = fVar13;
  b.h = fVar15;
  b.w = local_e8;
  nk_widget_text(pnVar3,b,(char *)local_d8,
                 ((int)((ulong)lVar7 >> 0x20) + (int)local_b8) - (int)local_d8,&local_68,0x12,f);
  local_100 = local_100 + iVar9 + 1;
  local_d8 = (nk_style_edit *)((long)&(pnVar2->normal).type + (long)local_100);
  iVar5 = nk_utf_decode((char *)local_d8,&local_f8,(int)local_b0 + iVar6);
  uVar11 = (ulong)local_f0;
  if ((int)local_f0 <= local_100) {
    return;
  }
  local_d0 = (ulong)((int)local_d0 + 1);
  local_98 = CONCAT44(local_98._4_4_,(float)local_98 + local_88);
  if (iVar5 == 0) {
    return;
  }
  goto LAB_00145ecd;
}

Assistant:

NK_LIB void
nk_edit_draw_text(struct nk_command_buffer *out,
    const struct nk_style_edit *style, float pos_x, float pos_y,
    float x_offset, const char *text, int byte_len, float row_height,
    const struct nk_user_font *font, struct nk_color background,
    struct nk_color foreground, int is_selected)
{
    NK_ASSERT(out);
    NK_ASSERT(font);
    NK_ASSERT(style);
    if (!text || !byte_len || !out || !style) return;

    {int glyph_len = 0;
    nk_rune unicode = 0;
    int text_len = 0;
    float line_width = 0;
    float glyph_width;
    const char *line = text;
    float line_offset = 0;
    int line_count = 0;

    struct nk_text txt;
    txt.padding = nk_vec2(0,0);
    txt.background = background;
    txt.text = foreground;

    glyph_len = nk_utf_decode(text+text_len, &unicode, byte_len-text_len);
    if (!glyph_len) return;
    while ((text_len < byte_len) && glyph_len)
    {
        if (unicode == '\n') {
            /* new line separator so draw previous line */
            struct nk_rect label;
            label.y = pos_y + line_offset;
            label.h = row_height;
            label.w = line_width;
            label.x = pos_x;
            if (!line_count)
                label.x += x_offset;

            if (is_selected) /* selection needs to draw different background color */
                nk_fill_rect(out, label, 0, background);
            nk_widget_text(out, label, line, (int)((text + text_len) - line),
                &txt, NK_TEXT_CENTERED, font);

            text_len++;
            line_count++;
            line_width = 0;
            line = text + text_len;
            line_offset += row_height;
            glyph_len = nk_utf_decode(text + text_len, &unicode, (int)(byte_len-text_len));
            continue;
        }
        if (unicode == '\r') {
            text_len++;
            glyph_len = nk_utf_decode(text + text_len, &unicode, byte_len-text_len);
            continue;
        }
        glyph_width = font->width(font->userdata, font->height, text+text_len, glyph_len);
        line_width += (float)glyph_width;
        text_len += glyph_len;
        glyph_len = nk_utf_decode(text + text_len, &unicode, byte_len-text_len);
        continue;
    }
    if (line_width > 0) {
        /* draw last line */
        struct nk_rect label;
        label.y = pos_y + line_offset;
        label.h = row_height;
        label.w = line_width;
        label.x = pos_x;
        if (!line_count)
            label.x += x_offset;

        if (is_selected)
            nk_fill_rect(out, label, 0, background);
        nk_widget_text(out, label, line, (int)((text + text_len) - line),
            &txt, NK_TEXT_LEFT, font);
    }}
}